

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

Symbol * addlnksymbol(GlobalVars *gv,char *name,lword val,uint8_t type,uint8_t flags,uint8_t info,
                     uint8_t bind,uint32_t size)

{
  Symbol **ppSVar1;
  unsigned_long uVar2;
  Symbol **ppSVar3;
  Symbol *pSVar4;
  
  if (gv->lnksyms == (Symbol **)0x0) {
    ppSVar1 = (Symbol **)alloc_hashtable(0x10);
    gv->lnksyms = ppSVar1;
  }
  ppSVar1 = gv->lnksyms;
  uVar2 = elf_hash(name);
  ppSVar1 = ppSVar1 + ((uint)uVar2 & 0xf);
  do {
    ppSVar3 = ppSVar1;
    pSVar4 = *ppSVar3;
    ppSVar1 = &pSVar4->obj_chain;
  } while (pSVar4 != (Symbol *)0x0);
  pSVar4 = (Symbol *)alloczero(0x50);
  *ppSVar3 = pSVar4;
  pSVar4->name = name;
  pSVar4->value = val;
  pSVar4->type = type;
  pSVar4->flags = flags;
  pSVar4->info = info;
  pSVar4->bind = bind;
  pSVar4->size = size;
  return pSVar4;
}

Assistant:

struct Symbol *addlnksymbol(struct GlobalVars *gv,const char *name,lword val,
                            uint8_t type,uint8_t flags,uint8_t info,
                            uint8_t bind,uint32_t size)
/* Define a new, target-specific, linker symbol. */
{
  struct Symbol *sym;
  struct Symbol **chain;

  if (gv->lnksyms == NULL)
    gv->lnksyms = alloc_hashtable(LNKSYMHTABSIZE);
  chain = &gv->lnksyms[elf_hash(name)%LNKSYMHTABSIZE];

  while (sym = *chain)
    chain = &sym->obj_chain;
  *chain = sym = alloczero(sizeof(struct Symbol));
  sym->name = name;
  sym->value = val;
  sym->type = type;
  sym->flags = flags;
  sym->info = info;
  sym->bind = bind;
  sym->size = size;
  return sym;
}